

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_split.hpp
# Opt level: O0

array<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_2UL>
* detail::operator|(array<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_2UL>
                    *__return_storage_ptr__,b_str<wchar_t> *str,
                   split_helper_subroutine<detail::split_at_first,_wchar_t,_wchar_t> *info)

{
  split_helper_subroutine<detail::split_at_first,_wchar_t,_wchar_t> *psVar1;
  reference pvVar2;
  wstring local_50 [39];
  undefined1 local_29;
  ulong local_28;
  size_t pos;
  split_helper_subroutine<detail::split_at_first,_wchar_t,_wchar_t> *info_local;
  b_str<wchar_t> *str_local;
  array<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_2UL>
  *re;
  
  pos = (size_t)info;
  info_local = (split_helper_subroutine<detail::split_at_first,_wchar_t,_wchar_t> *)str;
  str_local = __return_storage_ptr__->_M_elems;
  local_28 = std::__cxx11::wstring::find_first_of((wchar_t)str,(ulong)(uint)info->delim);
  if (local_28 == 0xffffffffffffffff) {
    std::__cxx11::wstring::wstring((wstring *)__return_storage_ptr__,(wstring *)info_local);
    std::__cxx11::wstring::wstring((wstring *)(__return_storage_ptr__->_M_elems + 1));
  }
  else {
    local_29 = 0;
    std::
    array<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_2UL>
    ::array(__return_storage_ptr__);
    psVar1 = info_local;
    std::__cxx11::wstring::find_first_not_of((wchar_t)info_local,(ulong)*(uint *)pos);
    std::__cxx11::wstring::substr((ulong)local_50,(ulong)psVar1);
    pvVar2 = std::
             array<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_2UL>
             ::operator[](__return_storage_ptr__,1);
    std::__cxx11::wstring::operator=((wstring *)pvVar2,local_50);
    std::__cxx11::wstring::~wstring(local_50);
    std::__cxx11::wstring::erase((ulong)info_local,local_28);
    psVar1 = info_local;
    pvVar2 = std::
             array<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_2UL>
             ::operator[](__return_storage_ptr__,0);
    std::__cxx11::wstring::operator=((wstring *)pvVar2,(wstring *)psVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::array<b_str<CharType>, 2> operator| (b_str<CharType>&& str, const split_helper_subroutine<split_at_first, DelimType, CharType>& info)
	{
		const std::size_t pos = str.find_first_of(info.delim);
		if (b_str<CharType>::npos == pos) return{ { std::move(str),{} } };
		std::array<b_str<CharType>, 2> re;
		re[1] = str.substr(str.find_first_not_of(info.delim, pos));
		str.erase(pos);
		re[0] = std::move(str);
		return re;
	}